

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minijson_reader.hpp
# Opt level: O0

value * minijson::detail::parse_unquoted_value<minijson::buffer_context>
                  (value *__return_storage_ptr__,buffer_context *context)

{
  int iVar1;
  char *__s1;
  long long_value_00;
  number_parse_error *anon_var_0_1;
  number_parse_error *anon_var_0;
  double double_value;
  long long_value;
  char *buffer;
  buffer_context *context_local;
  
  __s1 = buffer_context_base::write_buffer(&context->super_buffer_context_base);
  iVar1 = strcmp(__s1,"true");
  if (iVar1 == 0) {
    value::value(__return_storage_ptr__,Boolean,__s1,1,1.0);
  }
  else {
    iVar1 = strcmp(__s1,"false");
    if (iVar1 == 0) {
      value::value(__return_storage_ptr__,Boolean,__s1,0,0.0);
    }
    else {
      iVar1 = strcmp(__s1,"null");
      if (iVar1 == 0) {
        value::value(__return_storage_ptr__,Null,__s1,0,0.0);
      }
      else {
        long_value_00 = parse_long(__s1,10);
        value::value(__return_storage_ptr__,Number,__s1,long_value_00,(double)long_value_00);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

value parse_unquoted_value(const Context& context)
{
    const char* const buffer = context.write_buffer();

    if (strcmp(buffer, "true") == 0)
    {
        return value(Boolean, buffer, 1, 1.0);
    }
    else if (strcmp(buffer, "false") == 0)
    {
        return value(Boolean, buffer, 0, 0.0);
    }
    else if (strcmp(buffer, "null") == 0)
    {
        return value(Null, buffer, 0, 0.0);
    }
    else
    {
        long long_value = 0;
        double double_value = 0.0;

        try
        {
            long_value = parse_long(buffer);
            double_value = long_value;
        }
        catch (const number_parse_error&)
        {
            try
            {
                double_value = parse_double(buffer);
            }
            catch (const number_parse_error&)
            {
                throw parse_error(context, parse_error::INVALID_VALUE);
            }
        }

        return value(Number, buffer, long_value, double_value);
    }
}